

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_linkpool_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  long *plVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  int iVar13;
  long *in_FS_OFFSET;
  
  int_linkpool_init();
  lVar1 = *in_FS_OFFSET;
  lVar2 = in_FS_OFFSET[-5];
  int_linkpool_thrd_init();
  puVar3 = (undefined8 *)in_FS_OFFSET[-5];
  int_linkpool_grow(0x20);
  plVar4 = (long *)in_FS_OFFSET[-4];
  lVar5 = *plVar4;
  *(long *)(lVar5 + 8) = plVar4[1];
  *(long *)plVar4[1] = lVar5;
  *plVar4 = 0;
  plVar4[1] = 0;
  int_linkpool_grow(0x20);
  plVar6 = (long *)in_FS_OFFSET[-4];
  lVar5 = *plVar6;
  *(long *)(lVar5 + 8) = plVar6[1];
  *(long *)plVar6[1] = lVar5;
  *plVar6 = 0;
  plVar6[1] = 0;
  int_linkpool_grow(0x20);
  plVar7 = (long *)in_FS_OFFSET[-4];
  lVar5 = *plVar7;
  *(long *)(lVar5 + 8) = plVar7[1];
  *(long *)plVar7[1] = lVar5;
  *plVar7 = 0;
  plVar7[1] = 0;
  puVar8 = (undefined8 *)in_FS_OFFSET[-5];
  *(undefined4 *)(plVar4 + 2) = 0x3039;
  testfunc_linkpool_init();
  testfunc_linkpool_thrd_init();
  testfunc_linkpool_grow(0x20);
  plVar9 = (long *)in_FS_OFFSET[-1];
  lVar5 = *plVar9;
  *(long *)(lVar5 + 8) = plVar9[1];
  *(long *)plVar9[1] = lVar5;
  *plVar9 = 0;
  plVar9[1] = 0;
  testfunc_linkpool_grow(0x20);
  plVar10 = (long *)in_FS_OFFSET[-1];
  lVar5 = *plVar10;
  *(long *)(lVar5 + 8) = plVar10[1];
  *(long *)plVar10[1] = lVar5;
  *plVar10 = 0;
  plVar10[1] = 0;
  if (*plVar9 == 0) {
    puVar11 = (undefined8 *)in_FS_OFFSET[-1];
    plVar9[1] = (long)puVar11;
    *puVar11 = plVar9;
    *plVar9 = lVar1 + -0x10;
    in_FS_OFFSET[-1] = (long)plVar9;
    testfunc_linkpool_grow(0x20);
    plVar9 = (long *)in_FS_OFFSET[-1];
    lVar5 = *plVar9;
    *(long *)(lVar5 + 8) = plVar9[1];
    *(long *)plVar9[1] = lVar5;
    *plVar9 = 0;
    plVar9[1] = 0;
    plVar9[2] = (long)testfunc_increment;
    iVar13 = (int)plVar4[2] + 1;
    *(int *)(plVar4 + 2) = iVar13;
    if (*plVar4 == 0) {
      puVar11 = (undefined8 *)(lVar1 + -0x28);
      puVar12 = (undefined8 *)in_FS_OFFSET[-4];
      plVar4[1] = (long)puVar12;
      *puVar12 = plVar4;
      *plVar4 = (long)puVar11;
      in_FS_OFFSET[-4] = (long)plVar4;
      if (*plVar6 == 0) {
        plVar6[1] = (long)plVar4;
        *plVar4 = (long)plVar6;
        *plVar6 = (long)puVar11;
        in_FS_OFFSET[-4] = (long)plVar6;
        if (*plVar7 == 0) {
          plVar7[1] = (long)plVar6;
          *plVar6 = (long)plVar7;
          *plVar7 = (long)puVar11;
          in_FS_OFFSET[-4] = (long)plVar7;
          puVar12 = (undefined8 *)in_FS_OFFSET[-5];
          if (puVar12 != (undefined8 *)0x0) {
            uo_queue_enqueue(int_linkpool_queue,(void *)in_FS_OFFSET[-6],true);
            *puVar11 = 0;
            *(undefined8 *)(lVar1 + -0x20) = 0;
          }
          if (in_FS_OFFSET[-2] != 0) {
            uo_queue_enqueue(testfunc_linkpool_queue,(void *)in_FS_OFFSET[-3],true);
            *(undefined8 *)(lVar1 + -0x10) = 0;
            *(undefined8 *)(lVar1 + -8) = 0;
          }
          return (int)(((puVar8 == puVar11 || (lVar2 != 0 || puVar3 != puVar11)) ||
                       puVar12 == puVar11) || iVar13 != 0x303a);
        }
      }
    }
  }
  __assert_fail("!uo__linklist_is_linked(link)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_linklist/src/include/uo_linklist/uo_linklist.h"
                ,0xa6,"void uo__linklist_link(uo_linklist *, uo_linklist *)");
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    passed &= int_linkpool_init();
    passed &= !int_linkpool_is_thrd_init();
    passed &= int_linkpool_thrd_init();
    passed &= int_linkpool_is_thrd_init();
    passed &= int_linkpool_is_empty();

    int_linklist *i0 = int_linkpool_rent();
    int_linklist *i1 = int_linkpool_rent();
    int_linklist *i2 = int_linkpool_rent();

    passed &= !int_linkpool_is_empty();

    i0->item = 12345;
    passed &= i0->item == 12345;

    passed &= testfunc_linkpool_init();
    passed &= testfunc_linkpool_thrd_init();

    testfunc_linklist *f0 = testfunc_linkpool_rent();
    testfunc_linklist *f1 = testfunc_linkpool_rent();
    testfunc_linkpool_return(f0);
    f0 = testfunc_linkpool_rent();

    f0->item = testfunc_increment;

    f0->item(&i0->item);

    passed &= i0->item == 12346;

    int_linkpool_return(i0);
    int_linkpool_return(i1);
    int_linkpool_return(i2);

    passed &= !int_linkpool_is_empty();

    int_linkpool_thrd_quit();
    testfunc_linkpool_thrd_quit();

    return passed ? 0 : 1;
}